

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O0

void write_colormap(j_decompress_ptr cinfo,bmp_dest_ptr dest,int map_colors,int map_entry_size)

{
  int iVar1;
  long *plVar2;
  FILE *__stream;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int i;
  FILE *outfile;
  int num_colors;
  JSAMPARRAY colormap;
  int local_34;
  
  plVar2 = (long *)in_RDI[0x14];
  iVar1 = *(int *)((long)in_RDI + 0x9c);
  __stream = *(FILE **)(in_RSI + 0x20);
  if (plVar2 == (long *)0x0) {
    for (local_34 = 0; local_34 < 0x100; local_34 = local_34 + 1) {
      putc(local_34,__stream);
      putc(local_34,__stream);
      putc(local_34,__stream);
      if (in_ECX == 4) {
        putc(0,__stream);
      }
    }
  }
  else if ((int)in_RDI[0x12] == 3) {
    for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
      putc((uint)*(byte *)(plVar2[2] + (long)local_34),__stream);
      putc((uint)*(byte *)(plVar2[1] + (long)local_34),__stream);
      putc((uint)*(byte *)(*plVar2 + (long)local_34),__stream);
      if (in_ECX == 4) {
        putc(0,__stream);
      }
    }
  }
  else {
    for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
      putc((uint)*(byte *)(*plVar2 + (long)local_34),__stream);
      putc((uint)*(byte *)(*plVar2 + (long)local_34),__stream);
      putc((uint)*(byte *)(*plVar2 + (long)local_34),__stream);
      if (in_ECX == 4) {
        putc(0,__stream);
      }
    }
  }
  if (in_EDX < local_34) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x413;
    *(int *)(*in_RDI + 0x2c) = local_34;
    (**(code **)*in_RDI)();
  }
  for (; local_34 < in_EDX; local_34 = local_34 + 1) {
    putc(0,__stream);
    putc(0,__stream);
    putc(0,__stream);
    if (in_ECX == 4) {
      putc(0,__stream);
    }
  }
  return;
}

Assistant:

LOCAL(void)
write_colormap(j_decompress_ptr cinfo, bmp_dest_ptr dest, int map_colors,
               int map_entry_size)
{
  JSAMPARRAY colormap = cinfo->colormap;
  int num_colors = cinfo->actual_number_of_colors;
  FILE *outfile = dest->pub.output_file;
  int i;

  if (colormap != NULL) {
    if (cinfo->out_color_components == 3) {
      /* Normal case with RGB colormap */
      for (i = 0; i < num_colors; i++) {
        putc(colormap[2][i], outfile);
        putc(colormap[1][i], outfile);
        putc(colormap[0][i], outfile);
        if (map_entry_size == 4)
          putc(0, outfile);
      }
    } else {
      /* Grayscale colormap (only happens with grayscale quantization) */
      for (i = 0; i < num_colors; i++) {
        putc(colormap[0][i], outfile);
        putc(colormap[0][i], outfile);
        putc(colormap[0][i], outfile);
        if (map_entry_size == 4)
          putc(0, outfile);
      }
    }
  } else {
    /* If no colormap, must be grayscale data.  Generate a linear "map". */
    for (i = 0; i < 256; i++) {
      putc(i, outfile);
      putc(i, outfile);
      putc(i, outfile);
      if (map_entry_size == 4)
        putc(0, outfile);
    }
  }
  /* Pad colormap with zeros to ensure specified number of colormap entries */
  if (i > map_colors)
    ERREXIT1(cinfo, JERR_TOO_MANY_COLORS, i);
  for (; i < map_colors; i++) {
    putc(0, outfile);
    putc(0, outfile);
    putc(0, outfile);
    if (map_entry_size == 4)
      putc(0, outfile);
  }
}